

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManPrintCuts(Of_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  size_t __n;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vFirst;
  int *__s;
  Vec_Int_t *vCutNum;
  int *__s_00;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar5;
  uint uVar6;
  uint nCutsAll;
  uint uVar7;
  uint *puVar8;
  long lVar9;
  uint Entry;
  int iVar10;
  int iVar11;
  uint *puVar12;
  
  pGVar5 = p->pGia;
  iVar2 = pGVar5->nObjs;
  vFirst = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar10 = iVar2;
  }
  vFirst->nCap = iVar10;
  if (iVar10 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar10 * 4);
  }
  vFirst->pArray = __s;
  vFirst->nSize = iVar2;
  __n = (long)iVar2 * 4;
  memset(__s,0xff,__n);
  vCutNum = (Vec_Int_t *)malloc(0x10);
  Entry = 0;
  vCutNum->nCap = iVar10;
  if (iVar10 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar10 << 2);
  }
  vCutNum->pArray = __s_00;
  vCutNum->nSize = iVar2;
  memset(__s_00,0xff,__n);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_01->pArray = piVar4;
  uVar6 = ~(pGVar5->vCos->nSize + pGVar5->vCis->nSize) + iVar2;
  Gia_ManFillValue(pGVar5);
  pGVar5 = p->pGia;
  nCutsAll = 0;
  if (0 < pGVar5->nObjs) {
    lVar9 = 0;
    nCutsAll = 0;
    Entry = 0;
    do {
      if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar5->pObjs + lVar9;
      uVar3 = *(uint *)pGVar1;
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        if (p->pObjs[lVar9].nRefs == 0) {
          puVar12 = (uint *)0x0;
        }
        else {
          Vec_IntPush(p_00,Entry);
          if ((lVar9 == 0) || (pGVar5 = p->pGia, pGVar5->nObjs <= lVar9)) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar3 = p->pObjs[lVar9].iCutH;
          uVar7 = (int)uVar3 >> 0x10;
          if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) goto LAB_00741685;
          puVar12 = (uint *)((ulong)((uVar3 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar7]);
        }
        pGVar1->Value = Entry;
        if ((p->vCutSets).nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = (p->vCutSets).pArray[lVar9];
        uVar7 = (int)uVar3 >> 0x10;
        if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) {
LAB_00741685:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (iVar2 <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        Entry = Entry + 1;
        piVar4 = (int *)((ulong)((uVar3 & 0xffff) << 2) + (long)(p->vPages).pArray[uVar7]);
        iVar10 = *piVar4;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        __s[lVar9] = nCutsAll + uVar6;
        __s_00[lVar9] = iVar10;
        iVar10 = *piVar4;
        if (0 < iVar10) {
          puVar8 = (uint *)(piVar4 + 1);
          iVar11 = 0;
          do {
            if (puVar12 == puVar8) {
              Vec_IntPush(p_01,nCutsAll + uVar6 + iVar11);
              iVar10 = *piVar4;
            }
            iVar11 = iVar11 + 1;
            puVar8 = puVar8 + (ulong)(*puVar8 & 0x1f) + 4;
          } while (iVar11 < iVar10);
          pGVar5 = p->pGia;
          nCutsAll = nCutsAll + iVar11;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pGVar5->nObjs);
  }
  if (Entry != uVar6) {
    __assert_fail("nAndsAll == Shift",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0x68b,"void Of_ManPrintCuts(Of_Man_t *)");
  }
  printf("Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n",(ulong)uVar6,(ulong)(uint)p_00->nSize,
         (ulong)nCutsAll);
  Of_ManCreateSat(p,nCutsAll,vFirst,vCutNum,p_00,p_01);
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vFirst);
  if (__s_00 != (int *)0x0) {
    free(__s_00);
  }
  free(vCutNum);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  return;
}

Assistant:

void Of_ManPrintCuts( Of_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    int * pCutSet, * pCut, * pCutBest;
    int i, k, v, Var, nCuts;
    Vec_Int_t * vFirst  = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCutNum = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vBestNode = Vec_IntAlloc( 100 );
    Vec_Int_t * vBestCut  = Vec_IntAlloc( 100 );
    int nAndsAll = 0, nCutsAll = 0, Shift = Gia_ManAndNum(p->pGia);
    Gia_ManFillValue( p->pGia );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        // get the best cut
        pCutBest = NULL;
        if ( Of_ObjRefNum(p, i) )
        {
            Vec_IntPush( vBestNode, nAndsAll );
            pCutBest = Of_ObjCutBestP( p, i ); 
        }
        pObj->Value = nAndsAll++;
        // get the cutset
        pCutSet = Of_ObjCutSet(p, i);
        // count cuts
        nCuts = 0;
        Of_SetForEachCut( pCutSet, pCut, k )
            nCuts++;
        // save
        Vec_IntWriteEntry( vFirst,  i, Shift + nCutsAll );
        Vec_IntWriteEntry( vCutNum, i, nCuts );
        // print cuts
        if ( fVerbose )
            printf( "Node %d. Cuts %d.\n", i, nCuts );
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            if ( fVerbose )
            {
                printf( "{ " );
                Of_CutForEachVar( pCut, Var, v )
                    printf( "%d ", Var );
                printf( "} %s\n", pCutBest == pCut ? "best" :"" );
            }
            if ( pCutBest == pCut )
                Vec_IntPush( vBestCut, Shift + nCutsAll );
            nCutsAll++;
        }
    }
    assert( nAndsAll == Shift );
    printf( "Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n", nAndsAll, Vec_IntSize(vBestNode), nCutsAll );

    // create SAT problem
    Of_ManCreateSat( p, nCutsAll, vFirst, vCutNum, vBestNode, vBestCut );

    Vec_IntFree( vFirst );
    Vec_IntFree( vCutNum );
    Vec_IntFree( vBestNode );
    Vec_IntFree( vBestCut );
}